

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void copy_tensor(TENSOR *src,int copy_channels,int dst_offset,TENSOR *dst)

{
  ulong uVar1;
  int iVar2;
  
  if ((src->stride == dst->width) && (dst->stride == dst->width)) {
    if (0 < copy_channels) {
      uVar1 = 0;
      do {
        memcpy(dst->buf[(long)dst_offset + uVar1],src->buf[uVar1],
               (long)src->height * (long)src->width * 4);
        uVar1 = uVar1 + 1;
      } while ((uint)copy_channels != uVar1);
    }
  }
  else if (0 < copy_channels) {
    uVar1 = 0;
    do {
      if (0 < dst->height) {
        iVar2 = 0;
        do {
          memcpy(dst->buf[(long)dst_offset + uVar1] + (long)dst->stride * (long)iVar2,
                 src->buf[uVar1] + (long)src->stride * (long)iVar2,(long)dst->width << 2);
          iVar2 = iVar2 + 1;
        } while (iVar2 < dst->height);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)copy_channels);
  }
  return;
}

Assistant:

static void copy_tensor(const TENSOR *src, int copy_channels, int dst_offset,
                        TENSOR *dst) {
  assert(src->width == dst->width);
  assert(src->height == dst->height);
  assert(copy_channels <= src->channels);
  if (src->stride == dst->width && dst->stride == dst->width) {
    for (int c = 0; c < copy_channels; ++c) {
      memcpy(dst->buf[dst_offset + c], src->buf[c],
             sizeof(*dst->buf[0]) * src->width * src->height);
    }
  } else {
    for (int c = 0; c < copy_channels; ++c) {
      for (int r = 0; r < dst->height; ++r) {
        memcpy(&dst->buf[dst_offset + c][r * dst->stride],
               &src->buf[c][r * src->stride],
               dst->width * sizeof(*dst->buf[c]));
      }
    }
  }
}